

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# unicode_compare.hpp
# Opt level: O3

bool jessilib::equals<char,char16_t>
               (basic_string_view<char,_std::char_traits<char>_> lhs,
               basic_string_view<char16_t,_std::char_traits<char16_t>_> rhs)

{
  char16_t *pcVar1;
  char *pcVar2;
  char *pcVar3;
  long lVar4;
  char32_t cVar5;
  jessilib *this;
  char *pcVar6;
  decode_result dVar7;
  basic_string_view<char,_std::char_traits<char>_> in_string;
  
  pcVar6 = lhs._M_str;
  this = (jessilib *)lhs._M_len;
  pcVar1 = rhs._M_str;
  pcVar3 = (char *)rhs._M_len;
  pcVar2 = pcVar3;
  while( true ) {
    if (this == (jessilib *)0x0) {
      return pcVar3 == (char *)0x0;
    }
    if (pcVar3 == (char *)0x0) break;
    in_string._M_str = pcVar2;
    in_string._M_len = (size_t)pcVar6;
    dVar7 = decode_codepoint_utf8<char>(this,in_string);
    pcVar2 = (char *)dVar7.units;
    cVar5 = (char32_t)(ushort)*pcVar1;
    lVar4 = 1;
    if (((pcVar3 != (char *)0x1) && ((cVar5 & 0xfc00U) == 0xd800)) &&
       (((ushort)pcVar1[1] & 0xfc00) == 0xdc00)) {
      cVar5 = (uint)(ushort)*pcVar1 * 0x400 + (uint)(ushort)pcVar1[1] + L'\xfca02400';
      lVar4 = 2;
    }
    if (pcVar2 == (char *)0x0) {
      return false;
    }
    if (dVar7.codepoint != cVar5) {
      return false;
    }
    pcVar6 = pcVar6 + (long)pcVar2;
    pcVar3 = pcVar3 + -lVar4;
    pcVar1 = pcVar1 + lVar4;
    this = this + -(long)pcVar2;
  }
  return false;
}

Assistant:

bool equals(std::basic_string_view<LhsCharT> lhs, std::basic_string_view<RhsCharT> rhs) {
	// If lhs and rhs are the same type, compare their sizes and quickly return if not same
	if constexpr (std::is_same_v<LhsCharT, RhsCharT>) {
		return lhs == rhs;
	}

	while (!lhs.empty() && !rhs.empty()) {
		auto lhs_front = decode_codepoint(lhs);
		auto rhs_front = decode_codepoint(rhs);

		if (lhs_front.units == 0
			|| rhs_front.units == 0) {
			// Failed to decode front codepoint; bad unicode sequence
			return false;
		}

		if (lhs_front.codepoint != rhs_front.codepoint) {
			// Codepoints aren't the same
			return false;
		}

		// Codepoints are equal; trim off the fronts and continue
		lhs.remove_prefix(lhs_front.units);
		rhs.remove_prefix(rhs_front.units);
	}

	return lhs.empty() && rhs.empty();
}